

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::aggregator(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  bool bVar1;
  int row;
  int col;
  pair<int,_int> *ppVar2;
  pointer piVar3;
  bool bVar4;
  HighsInt HVar5;
  Result RVar6;
  ulong uVar7;
  pointer pdVar8;
  double *pdVar9;
  iterator __first;
  int iVar10;
  int iVar11;
  ulong uVar12;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var13;
  int iVar14;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __first_00;
  pair<int,_int> *ppVar15;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var16;
  long lVar17;
  int *piVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  bVar1 = (this->analysis_).logging_on_;
  if (bVar1 == true) {
    HPresolveAnalysis::startPresolveRuleLog(&this->analysis_,0xc);
  }
  this_00 = &this->substitutionOpportunities;
  ppVar15 = (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVar2 = (this->substitutionOpportunities).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar12 = (long)ppVar2 - (long)ppVar15;
  uVar7 = uVar12;
  _Var13._M_current = ppVar15;
  if (0 < (long)uVar12 >> 5) {
    _Var13._M_current = (pair<int,_int> *)((long)&ppVar15->first + (uVar12 & 0xffffffffffffffe0));
    lVar17 = ((long)uVar12 >> 5) + 1;
    _Var16._M_current = ppVar15;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)this,_Var16);
      __first_00._M_current = _Var16._M_current;
      if (bVar4) goto LAB_003135c8;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)this,_Var16._M_current + 1);
      __first_00._M_current = _Var16._M_current + 1;
      if (bVar4) goto LAB_003135c8;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)this,_Var16._M_current + 2);
      __first_00._M_current = _Var16._M_current + 2;
      if (bVar4) goto LAB_003135c8;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)this,_Var16._M_current + 3);
      __first_00._M_current = _Var16._M_current + 3;
      if (bVar4) goto LAB_003135c8;
      _Var16._M_current = _Var16._M_current + 4;
      lVar17 = lVar17 + -1;
    } while (1 < lVar17);
    uVar7 = (long)ppVar2 - (long)_Var13._M_current;
  }
  lVar17 = (long)uVar7 >> 3;
  if (lVar17 == 1) {
LAB_003135af:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
            operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                        *)this,_Var13);
    __first_00._M_current = _Var13._M_current;
    if (!bVar4) {
      __first_00._M_current = ppVar2;
    }
LAB_003135c8:
    _Var13._M_current = __first_00._M_current + 1;
    if (_Var13._M_current != ppVar2 && __first_00._M_current != ppVar2) {
      do {
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
                operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                            *)this,_Var13);
        if (!bVar4) {
          (__first_00._M_current)->first = (_Var13._M_current)->first;
          (__first_00._M_current)->second = (_Var13._M_current)->second;
          __first_00._M_current = __first_00._M_current + 1;
        }
        _Var13._M_current = _Var13._M_current + 1;
      } while (_Var13._M_current != ppVar2);
    }
  }
  else {
    if (lVar17 == 2) {
LAB_0031359c:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)this,_Var13);
      __first_00._M_current = _Var13._M_current;
      if (!bVar4) {
        _Var13._M_current = _Var13._M_current + 1;
        goto LAB_003135af;
      }
      goto LAB_003135c8;
    }
    __first_00._M_current = ppVar2;
    if (lVar17 == 3) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)this,_Var13);
      __first_00._M_current = _Var13._M_current;
      if (!bVar4) {
        _Var13._M_current = _Var13._M_current + 1;
        goto LAB_0031359c;
      }
      goto LAB_003135c8;
    }
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_erase
            (this_00,(iterator)__first_00._M_current,ppVar15 + uVar12);
  _Var13._M_current =
       (this->substitutionOpportunities).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var16._M_current =
       (this->substitutionOpportunities).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var13._M_current != _Var16._M_current) {
    uVar7 = (long)_Var16._M_current - (long)_Var13._M_current >> 3;
    iVar10 = 0;
    if (1 < uVar7) {
      iVar10 = 0;
      do {
        uVar7 = (long)uVar7 >> 1;
        iVar10 = iVar10 + 1;
      } while (1 < uVar7);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
              (_Var13,_Var16,(anon_class_8_1_8991fb9c)this,iVar10,true);
    _Var13._M_current =
         (this->substitutionOpportunities).
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    _Var16._M_current =
         (this->substitutionOpportunities).
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  if (_Var16._M_current != _Var13._M_current) {
    iVar10 = 0;
    uVar7 = 0;
    do {
      ppVar15 = _Var13._M_current + uVar7;
      row = ppVar15->first;
      if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[row] == '\0') {
        col = _Var13._M_current[uVar7].second;
        if ((((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[col] != '\0') ||
            (bVar4 = isImpliedFree(this,col), !bVar4)) ||
           (bVar4 = isDualImpliedFree(this,row), !bVar4)) goto LAB_00313923;
        HVar5 = findNonzero(this,row,col);
        if (HVar5 == -1) {
LAB_00313918:
          ppVar15 = (this_00->
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                    _M_impl.super__Vector_impl_data._M_start + uVar7;
          goto LAB_00313923;
        }
        if ((((this->model->integrality_).
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start[col] != kInteger) ||
            (((this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[row] ==
              (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[row] &&
             (bVar4 = rowCoefficientsIntegral
                                (this,row,1.0 / (this->Avalue).
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start[HVar5]),
             bVar4)))) || (bVar4 = isImpliedIntegral(this,col), bVar4)) {
          iVar11 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[row];
          if ((iVar11 == 2) ||
             (iVar14 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[col], iVar14 == 2)) {
            getRowPositions(this,row,&this->rowpositions);
            substituteFreeCol(this,postsolve_stack,row,col,true);
            (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7].first = -1;
            RVar6 = removeRowSingletons(this,postsolve_stack);
            if (RVar6 != kOk) {
              return RVar6;
            }
            RVar6 = checkLimits(this,postsolve_stack);
          }
          else {
            if (iVar11 < iVar14) {
              dVar19 = getMaxAbsRowVal(this,row);
              pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            }
            else {
              pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar17 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[col];
              if (lVar17 == -1) {
                dVar19 = 0.0;
              }
              else {
                pdVar9 = pdVar8 + lVar17;
                dVar19 = 0.0;
                do {
                  if (dVar19 <= ABS(*pdVar9)) {
                    dVar19 = ABS(*pdVar9);
                  }
                  iVar11 = (int)lVar17;
                  lVar17 = (long)(this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start[iVar11];
                  pdVar9 = pdVar9 + (lVar17 - iVar11);
                } while (lVar17 != -1);
              }
            }
            dVar20 = ABS(pdVar8[HVar5]);
            dVar21 = (this->options->super_HighsOptionsStruct).presolve_pivot_threshold;
            if (dVar20 < dVar19 * dVar21) {
              if ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[row] <
                  (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[col]) {
                lVar17 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start[col];
                if (lVar17 == -1) {
                  dVar19 = 0.0;
                }
                else {
                  pdVar9 = pdVar8 + lVar17;
                  dVar19 = 0.0;
                  do {
                    if (dVar19 <= ABS(*pdVar9)) {
                      dVar19 = ABS(*pdVar9);
                    }
                    iVar11 = (int)lVar17;
                    lVar17 = (long)(this->Anext).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar11];
                    pdVar9 = pdVar9 + (lVar17 - iVar11);
                  } while (lVar17 != -1);
                }
              }
              else {
                dVar19 = getMaxAbsRowVal(this,row);
                dVar21 = (this->options->super_HighsOptionsStruct).presolve_pivot_threshold;
                dVar20 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[HVar5]);
              }
              if (dVar20 < dVar21 * dVar19) goto LAB_00313918;
            }
            getRowPositions(this,row,&this->rowpositions);
            iVar11 = 1 - ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[row] +
                         (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[col]);
            lVar17 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[col];
            if (lVar17 != -1) {
              piVar3 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar18 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar17;
              do {
                if (*piVar18 != row) {
                  HVar5 = countFillin(this,*piVar18);
                  iVar11 = iVar11 + HVar5;
                  if ((this->options->super_HighsOptionsStruct).presolve_substitution_maxfillin <
                      iVar11) break;
                }
                iVar14 = (int)lVar17;
                lVar17 = (long)piVar3[iVar14];
                piVar18 = piVar18 + (lVar17 - iVar14);
              } while (lVar17 != -1);
            }
            if ((this->options->super_HighsOptionsStruct).presolve_substitution_maxfillin < iVar11)
            {
              iVar10 = iVar10 + 1;
              if (iVar10 != 3) goto LAB_00313929;
              _Var13._M_current =
                   (this->substitutionOpportunities).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              _Var16._M_current =
                   (this->substitutionOpportunities).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              break;
            }
            substituteFreeCol(this,postsolve_stack,row,col,true);
            (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7].first = -1;
            RVar6 = removeRowSingletons(this,postsolve_stack);
            if (RVar6 != kOk) {
              return RVar6;
            }
            RVar6 = checkLimits(this,postsolve_stack);
            iVar10 = 0;
          }
          if (RVar6 != kOk) {
            return RVar6;
          }
        }
      }
      else {
LAB_00313923:
        ppVar15->first = -1;
      }
LAB_00313929:
      uVar7 = uVar7 + 1;
      _Var13._M_current =
           (this->substitutionOpportunities).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
      _Var16._M_current =
           (this->substitutionOpportunities).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    } while (uVar7 < (ulong)((long)_Var16._M_current - (long)_Var13._M_current >> 3));
  }
  uVar12 = (long)_Var16._M_current - (long)_Var13._M_current;
  uVar7 = uVar12;
  ppVar15 = _Var13._M_current;
  if (0 < (long)uVar12 >> 5) {
    ppVar15 = (pair<int,_int> *)((long)&(_Var13._M_current)->first + (uVar12 & 0xffffffffffffffe0));
    lVar17 = ((long)uVar12 >> 5) + 1;
    __first._M_current = _Var13._M_current + 2;
    do {
      if (__first._M_current[-2].first == -1) {
        __first._M_current = __first._M_current + -2;
        goto LAB_00313b26;
      }
      if (__first._M_current[-1].first == -1) {
        __first._M_current = __first._M_current + -1;
        goto LAB_00313b26;
      }
      if ((__first._M_current)->first == -1) goto LAB_00313b26;
      if (__first._M_current[1].first == -1) {
        __first._M_current = __first._M_current + 1;
        goto LAB_00313b26;
      }
      lVar17 = lVar17 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar17);
    uVar7 = (long)_Var16._M_current - (long)ppVar15;
  }
  lVar17 = (long)uVar7 >> 3;
  if (lVar17 == 1) {
LAB_00313b05:
    __first._M_current = ppVar15;
    if (ppVar15->first != -1) {
      __first._M_current = _Var16._M_current;
    }
  }
  else if (lVar17 == 2) {
LAB_00313afc:
    __first._M_current = ppVar15;
    if (ppVar15->first != -1) {
      ppVar15 = ppVar15 + 1;
      goto LAB_00313b05;
    }
  }
  else {
    __first._M_current = _Var16._M_current;
    if (lVar17 != 3) goto LAB_00313b52;
    __first._M_current = ppVar15;
    if (ppVar15->first != -1) {
      ppVar15 = ppVar15 + 1;
      goto LAB_00313afc;
    }
  }
LAB_00313b26:
  ppVar15 = __first._M_current;
  if (__first._M_current != _Var16._M_current) {
    while (ppVar2 = ppVar15, ppVar15 = ppVar2 + 1, ppVar15 != _Var16._M_current) {
      if (ppVar15->first != -1) {
        (__first._M_current)->first = ppVar15->first;
        (__first._M_current)->second = ppVar2[1].second;
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_00313b52:
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_erase
            (this_00,__first,_Var13._M_current + uVar12);
  (this->analysis_).logging_on_ = bVar1;
  if (bVar1 != false) {
    HPresolveAnalysis::stopPresolveRuleLog(&this->analysis_,0xc);
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::aggregator(HighsPostsolveStack& postsolve_stack) {
  assert(analysis_.allow_rule_[kPresolveRuleAggregator]);
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleAggregator);
  substitutionOpportunities.erase(
      std::remove_if(substitutionOpportunities.begin(),
                     substitutionOpportunities.end(),
                     [&](const std::pair<HighsInt, HighsInt>& p) {
                       HighsInt row = p.first;
                       HighsInt col = p.second;
                       return rowDeleted[row] || colDeleted[col] ||
                              !isImpliedFree(col) || !isDualImpliedFree(row);
                     }),
      substitutionOpportunities.end());

  pdqsort(
      substitutionOpportunities.begin(), substitutionOpportunities.end(),
      [&](const std::pair<HighsInt, HighsInt>& nz1,
          const std::pair<HighsInt, HighsInt>& nz2) {
        HighsInt minLen1 = std::min(rowsize[nz1.first], colsize[nz1.second]);
        HighsInt minLen2 = std::min(rowsize[nz2.first], colsize[nz2.second]);
        if (minLen1 == 2 && minLen2 != 2) return true;
        if (minLen2 == 2 && minLen1 != 2) return false;

        int64_t sizeProd1 = int64_t(rowsize[nz1.first]) * colsize[nz1.second];
        int64_t sizeProd2 = int64_t(rowsize[nz2.first]) * colsize[nz2.second];
        if (sizeProd1 < sizeProd2) return true;
        if (sizeProd2 < sizeProd1) return false;
        if (minLen1 < minLen2) return true;
        if (minLen2 < minLen1) return false;

        return std::make_tuple(HighsHashHelpers::hash(std::make_pair(
                                   uint32_t(nz1.first), uint32_t(nz1.second))),
                               nz1.first, nz1.second) <
               std::make_tuple(HighsHashHelpers::hash(std::make_pair(
                                   uint32_t(nz2.first), uint32_t(nz2.second))),
                               nz2.first, nz2.second);
      });

  HighsInt nfail = 0;
  for (size_t i = 0; i < substitutionOpportunities.size(); ++i) {
    HighsInt row = substitutionOpportunities[i].first;
    HighsInt col = substitutionOpportunities[i].second;

    if (rowDeleted[row] || colDeleted[col] || !isImpliedFree(col) ||
        !isDualImpliedFree(row)) {
      substitutionOpportunities[i].first = -1;
      continue;
    }

    HighsInt nzPos = findNonzero(row, col);
    if (nzPos == -1) {
      substitutionOpportunities[i].first = -1;
      continue;
    }
    if (model->integrality_[col] == HighsVarType::kInteger) {
      bool impliedIntegral =
          (rowsizeInteger[row] == rowsize[row] &&
           rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos])) ||
          isImpliedIntegral(col);
      if (!impliedIntegral) continue;
    }

    // in the case where the row has length two or the column has length two
    // we always do the substitution since the fillin can never be problematic
    if (rowsize[row] == 2 || colsize[col] == 2) {
      storeRow(row);
      substituteFreeCol(postsolve_stack, row, col, true);
      substitutionOpportunities[i].first = -1;
      HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
      continue;
    }

    double maxVal = rowsize[row] < colsize[col] ? getMaxAbsRowVal(row)
                                                : getMaxAbsColVal(col);
    if (std::fabs(Avalue[nzPos]) < maxVal * options->presolve_pivot_threshold) {
      maxVal = rowsize[row] < colsize[col] ? getMaxAbsColVal(col)
                                           : getMaxAbsRowVal(row);
      if (std::fabs(Avalue[nzPos]) <
          maxVal * options->presolve_pivot_threshold) {
        substitutionOpportunities[i].first = -1;
        continue;
      }
    }

    storeRow(row);
    HighsInt fillin = -(rowsize[row] + colsize[col] - 1);
    for (const auto& nz : getColumnVector(col)) {
      if (nz.index() == row) continue;
      fillin += countFillin(nz.index());

      if (fillin > options->presolve_substitution_maxfillin) break;
    }

    if (fillin > options->presolve_substitution_maxfillin) {
      ++nfail;
      // if the fill in is too much for multiple tries, then we stop
      // as this indicates that the rows/columns are becoming too dense
      // for substitutions
      if (nfail == 3) break;
      continue;
    }

    nfail = 0;
    substituteFreeCol(postsolve_stack, row, col, true);
    substitutionOpportunities[i].first = -1;
    HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
    HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
  }

  substitutionOpportunities.erase(
      std::remove_if(
          substitutionOpportunities.begin(), substitutionOpportunities.end(),
          [](const std::pair<HighsInt, HighsInt>& p) { return p.first == -1; }),
      substitutionOpportunities.end());

  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleAggregator);
  return Result::kOk;
}